

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCore.cc
# Opt level: O0

void __thiscall PowerCore::cancelInterrupt(PowerCore *this)

{
  PowerCore *this_local;
  
  LOCK();
  (this->interruptFlag).super___atomic_flag_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

void PowerCore::cancelInterrupt()
{
    interruptFlag.test_and_set();
}